

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O2

fdb_status sb_bmp_fetch_doc(fdb_kvs_handle *handle)

{
  pthread_spinlock_t *__lock;
  undefined8 *puVar1;
  superblock *psVar2;
  uint64_t bmp_size;
  docio_object *pdVar3;
  sb_rsv_bmp *psVar4;
  __pointer_type puVar5;
  int64_t iVar6;
  uint8_t *puVar7;
  ulong uVar8;
  long lVar9;
  fdb_status fVar10;
  long lVar11;
  ulong uVar12;
  char doc_key [64];
  
  psVar2 = handle->file->sb;
  if ((psVar2->bmp)._M_b._M_p != (__pointer_type)0x0) {
    return FDB_RESULT_SUCCESS;
  }
  if ((psVar2->bmp_size).super___atomic_base<unsigned_long>._M_i == 0) {
    return FDB_RESULT_SUCCESS;
  }
  __lock = &psVar2->lock;
  pthread_spin_lock(__lock);
  if ((psVar2->bmp)._M_b._M_p == (__pointer_type)0x0) {
    bmp_size = (psVar2->bmp_size).super___atomic_base<unsigned_long>._M_i;
    uVar8 = bmp_size + 0x7fffff >> 0x17;
    psVar2->num_bmp_docs = uVar8;
    if (0x7fffff < bmp_size + 0x7fffff) {
      free((psVar2->bmp)._M_b._M_p);
      puVar5 = (__pointer_type)calloc(1,bmp_size + 7 >> 3);
      LOCK();
      (psVar2->bmp)._M_b._M_p = puVar5;
      UNLOCK();
      lVar9 = 0;
      lVar11 = 0;
      uVar12 = 0;
      do {
        if (uVar8 == uVar12) {
          _construct_bmp_idx(&psVar2->bmp_idx,(psVar2->bmp)._M_b._M_p,bmp_size,
                             (psVar2->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i);
          psVar4 = psVar2->rsv_bmp;
          if ((psVar4 != (sb_rsv_bmp *)0x0) &&
             ((psVar4->status).super___atomic_base<unsigned_int>._M_i == 1)) {
            uVar8 = psVar4->bmp_size + 0x7fffff;
            uVar12 = uVar8 >> 0x17;
            psVar4->num_bmp_docs = uVar12;
            if (0x7fffff < uVar8) {
              puVar7 = (uint8_t *)calloc(1,psVar4->bmp_size + 7 >> 3);
              psVar4->bmp = puVar7;
              lVar9 = 0;
              lVar11 = 0;
              uVar8 = 0;
              while (uVar12 != uVar8) {
                pdVar3 = psVar4->bmp_docs;
                puVar1 = (undefined8 *)((long)&pdVar3->field_3 + lVar11);
                *puVar1 = 0;
                puVar1[1] = 0;
                puVar1 = (undefined8 *)((long)&pdVar3->timestamp + lVar11);
                *puVar1 = 0;
                puVar1[1] = 0;
                puVar1 = (undefined8 *)((long)&(pdVar3->length).keylen + lVar11);
                *puVar1 = 0;
                puVar1[1] = 0;
                *(undefined8 *)((long)&pdVar3->body + lVar11) = 0;
                pdVar3 = psVar4->bmp_docs;
                *(char **)((long)&pdVar3->key + lVar11) = doc_key;
                *(uint8_t **)((long)&pdVar3->body + lVar11) = psVar4->bmp + lVar9;
                iVar6 = docio_read_doc(handle->dhandle,psVar4->bmp_doc_offset[uVar8],
                                       (docio_object *)((long)&(pdVar3->length).keylen + lVar11),
                                       true);
                uVar8 = uVar8 + 1;
                lVar11 = lVar11 + 0x38;
                lVar9 = lVar9 + 0x100000;
                if (iVar6 < 1) {
                  free(psVar4->bmp);
                  free((psVar2->bmp)._M_b._M_p);
                  LOCK();
                  (psVar2->bmp)._M_b._M_p = (__pointer_type)0x0;
                  UNLOCK();
                  psVar4->bmp = (uint8_t *)0x0;
                  pthread_spin_unlock(__lock);
                  fVar10 = FDB_RESULT_SB_READ_FAIL;
                  if (iVar6 != 0) {
                    fVar10 = (fdb_status)iVar6;
                  }
                  return fVar10;
                }
              }
              _construct_bmp_idx(&psVar4->bmp_idx,psVar4->bmp,psVar4->bmp_size,0);
              LOCK();
              (psVar4->status).super___atomic_base<unsigned_int>._M_i = 0xffff;
              UNLOCK();
            }
          }
          pthread_spin_unlock(__lock);
          return FDB_RESULT_SUCCESS;
        }
        pdVar3 = psVar2->bmp_docs;
        puVar1 = (undefined8 *)((long)&pdVar3->field_3 + lVar11);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)&pdVar3->body + lVar11) = 0;
        puVar1 = (undefined8 *)((long)&pdVar3->timestamp + lVar11);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)&(pdVar3->length).keylen + lVar11);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(char **)((long)&psVar2->bmp_docs->key + lVar11) = doc_key;
        pdVar3 = psVar2->bmp_docs;
        *(__pointer_type *)((long)&pdVar3->body + lVar11) = (psVar2->bmp)._M_b._M_p + lVar9;
        iVar6 = docio_read_doc(handle->dhandle,psVar2->bmp_doc_offset[uVar12],
                               (docio_object *)((long)&(pdVar3->length).keylen + lVar11),true);
        uVar12 = uVar12 + 1;
        lVar11 = lVar11 + 0x38;
        lVar9 = lVar9 + 0x100000;
      } while (0 < iVar6);
      free((psVar2->bmp)._M_b._M_p);
      LOCK();
      (psVar2->bmp)._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      pthread_spin_unlock(__lock);
      if (iVar6 == 0) {
        return FDB_RESULT_SB_READ_FAIL;
      }
      return (fdb_status)iVar6;
    }
  }
  pthread_spin_unlock(__lock);
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status sb_bmp_fetch_doc(fdb_kvs_handle *handle)
{
    // == read bitmap from system docs ==
    size_t i;
    uint64_t num_docs;
    int64_t r_offset;
    char doc_key[64];
    struct superblock *sb = handle->file->sb;
    struct sb_rsv_bmp *rsv = NULL;

    // skip if previous bitmap exists OR
    // there is no bitmap to be fetched (fast screening)
    if (sb->bmp.load(std::memory_order_relaxed) ||
        atomic_get_uint64_t(&sb->bmp_size) == 0) {
        return FDB_RESULT_SUCCESS;
    }

    spin_lock(&sb->lock);

    // check once again if superblock is already initialized
    // while the thread was blocked by the lock.
    if (sb->bmp.load(std::memory_order_relaxed)) {
        spin_unlock(&sb->lock);
        return FDB_RESULT_SUCCESS;
    }

    uint64_t sb_bmp_size = atomic_get_uint64_t(&sb->bmp_size);
    sb->num_bmp_docs = num_docs = _bmp_size_to_num_docs(sb_bmp_size);
    if (!num_docs) {
        spin_unlock(&sb->lock);
        return FDB_RESULT_SUCCESS;
    }

    free(sb->bmp);
    sb->bmp = (uint8_t*)calloc(1, (sb_bmp_size+7) / 8);

    for (i=0; i<num_docs; ++i) {
        memset(&sb->bmp_docs[i], 0x0, sizeof(struct docio_object));
        // pre-allocated buffer for key
        sb->bmp_docs[i].key = (void*)doc_key;
        // directly point to the bitmap
        sb->bmp_docs[i].body = sb->bmp + (i * SB_MAX_BITMAP_DOC_SIZE);

        r_offset = docio_read_doc(handle->dhandle, sb->bmp_doc_offset[i],
                                  &sb->bmp_docs[i], true);
        if (r_offset <= 0) {
            // read fail
            free(sb->bmp);
            sb->bmp = NULL;

            spin_unlock(&sb->lock);
            return r_offset < 0 ? (fdb_status) r_offset : FDB_RESULT_SB_READ_FAIL;
        }
    }

    _construct_bmp_idx(&sb->bmp_idx, sb->bmp, sb_bmp_size,
                       atomic_get_uint64_t(&sb->cur_alloc_bid));

    rsv = sb->rsv_bmp;
    if (rsv && atomic_get_uint32_t(&rsv->status) == SB_RSV_INITIALIZING) {
        // reserved bitmap exists
        rsv->num_bmp_docs = num_docs = _bmp_size_to_num_docs(rsv->bmp_size);
        if (!num_docs) {
            spin_unlock(&sb->lock);
            return FDB_RESULT_SUCCESS;
        }

        rsv->bmp = (uint8_t*)calloc(1, (rsv->bmp_size+7) / 8);

        for (i=0; i<num_docs; ++i) {

            memset(&rsv->bmp_docs[i], 0x0, sizeof(struct docio_object));
            // pre-allocated buffer for key
            rsv->bmp_docs[i].key = (void*)doc_key;
            // directly point to the (reserved) bitmap
            rsv->bmp_docs[i].body = rsv->bmp + (i * SB_MAX_BITMAP_DOC_SIZE);

            r_offset = docio_read_doc(handle->dhandle, rsv->bmp_doc_offset[i],
                                      &rsv->bmp_docs[i], true);
            if (r_offset <= 0) {
                // read fail
                free(rsv->bmp);
                free(sb->bmp);
                rsv->bmp = sb->bmp = NULL;

                spin_unlock(&sb->lock);
                return r_offset < 0 ? (fdb_status) r_offset : FDB_RESULT_SB_READ_FAIL;
            }
        }

        _construct_bmp_idx(&rsv->bmp_idx, rsv->bmp, rsv->bmp_size, 0);
        atomic_store_uint32_t(&rsv->status, SB_RSV_READY);
    }

    spin_unlock(&sb->lock);
    return FDB_RESULT_SUCCESS;
}